

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> * __thiscall
Catch::TestRegistry::getAllTestsSorted(TestRegistry *this,IConfig *config)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  long *in_RSI;
  long in_RDI;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unaff_retaddr;
  IConfig *in_stack_00000008;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_00000250;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffffd8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffffe0;
  
  bVar2 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::empty
                    (in_stack_ffffffffffffffe0);
  if (bVar2) {
    enforceNoDuplicateTestCases(in_stack_00000250);
  }
  iVar1 = *(int *)(in_RDI + 0x20);
  iVar3 = (**(code **)(*in_RSI + 0x70))();
  if ((iVar1 != iVar3) ||
     (bVar2 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::empty
                        (in_stack_ffffffffffffffe0), bVar2)) {
    sortTests(in_stack_00000008,unaff_retaddr);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
              (in_stack_ffffffffffffffe0);
    uVar4 = (**(code **)(*in_RSI + 0x70))();
    *(undefined4 *)(in_RDI + 0x20) = uVar4;
  }
  return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)(in_RDI + 0x28);
}

Assistant:

virtual std::vector<TestCase> const& getAllTestsSorted( IConfig const& config ) const {
            if( m_sortedFunctions.empty() )
                enforceNoDuplicateTestCases( m_functions );

            if(  m_currentSortOrder != config.runOrder() || m_sortedFunctions.empty() ) {
                m_sortedFunctions = sortTests( config, m_functions );
                m_currentSortOrder = config.runOrder();
            }
            return m_sortedFunctions;
        }